

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O0

sbfMwThread sbfTport_nextThread(sbfTport tport)

{
  ulong uVar1;
  uint uVar2;
  sbfMwThread psVar3;
  ulong uVar4;
  long in_RDI;
  u_int i;
  u_int weight;
  sbfMwThread found;
  sbfMwThread thread;
  uint local_20;
  uint local_1c;
  sbfMwThread local_18;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x138));
  local_18 = (sbfMwThread)0x0;
  local_1c = 0xffffffff;
  for (local_20 = 0; uVar2 = sbfMw_getNumThreads(*(undefined8 *)(in_RDI + 0x10)), local_20 < uVar2;
      local_20 = local_20 + 1) {
    psVar3 = (sbfMwThread)sbfMw_getThread(*(undefined8 *)(in_RDI + 0x10),local_20);
    uVar1 = *(ulong *)(in_RDI + 0x30);
    uVar4 = sbfMw_getThreadMask(psVar3);
    if ((((uVar1 ^ 0xffffffffffffffff) & uVar4) == 0) &&
       (*(uint *)(in_RDI + 0x38 + (ulong)local_20 * 4) < local_1c)) {
      local_1c = *(uint *)(in_RDI + 0x38 + (ulong)local_20 * 4);
      local_18 = psVar3;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x138));
  return local_18;
}

Assistant:

sbfMwThread
sbfTport_nextThread (sbfTport tport)
{
    sbfMwThread thread;
    sbfMwThread found;
    u_int       weight;
    u_int       i;

    sbfMutex_lock (&tport->mWeightsLock);

    found = NULL;
    weight = UINT_MAX;

    for (i = 0; i < sbfMw_getNumThreads (tport->mMw); i++)
    {
        thread = sbfMw_getThread (tport->mMw, i);
        if (~tport->mThreads & sbfMw_getThreadMask (thread))
            continue;

        if (tport->mWeights[i] < weight)
        {
            found = thread;
            weight = tport->mWeights[i];
        }
    }

    sbfMutex_unlock (&tport->mWeightsLock);
    return found;
}